

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  vfloat<4> vVar5;
  BVH *bvh;
  size_t sVar6;
  Scene *pSVar7;
  float *pfVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  ulong uVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [12];
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  bool bVar36;
  uint uVar37;
  undefined4 uVar38;
  int iVar39;
  float *vertices;
  long lVar40;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar41;
  size_t sVar42;
  size_t sVar43;
  uint uVar44;
  NodeRef *pNVar45;
  NodeRef root;
  long lVar46;
  ulong uVar47;
  long lVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [64];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [64];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [64];
  float fVar166;
  undefined1 auVar167 [16];
  float fVar172;
  undefined1 auVar168 [16];
  float fVar170;
  float fVar171;
  undefined1 auVar169 [64];
  float fVar173;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar176 [64];
  Precalculations pre;
  float local_3918;
  float fStack_3914;
  float fStack_3910;
  RTCFilterFunctionNArguments args;
  undefined1 local_38b8 [16];
  RayK<4> *local_38a0;
  vbool<4> terminated;
  undefined1 local_3888 [16];
  float local_3828;
  float fStack_3824;
  float fStack_3820;
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_3768;
  undefined1 local_3738 [16];
  undefined1 local_3728 [16];
  undefined1 local_3718 [16];
  undefined1 local_3708 [16];
  uint local_36f8;
  uint uStack_36f4;
  uint uStack_36f0;
  uint uStack_36ec;
  uint uStack_36e8;
  uint uStack_36e4;
  uint uStack_36e0;
  uint uStack_36dc;
  undefined1 local_36d8 [16];
  TravRayK<4,_true> tray;
  Vec3vf<4> Ng;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  uVar35 = mm_lookupmask_ps._248_8_;
  uVar34 = mm_lookupmask_ps._240_8_;
  uVar33 = mm_lookupmask_ps._8_8_;
  uVar32 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar120 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar108 = vpcmpeqd_avx(auVar120,(undefined1  [16])valid_i->field_0);
    auVar95 = ZEXT816(0) << 0x40;
    auVar15 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar95,5);
    auVar105 = auVar108 & auVar15;
    if ((((auVar105 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar105 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar105 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar105[0xf] < '\0'
       ) {
      auVar15 = vandps_avx(auVar15,auVar108);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      local_36d8._8_4_ = 0x7fffffff;
      local_36d8._0_8_ = 0x7fffffff7fffffff;
      local_36d8._12_4_ = 0x7fffffff;
      auVar108 = vandps_avx(local_36d8,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar152._8_4_ = 0x219392ef;
      auVar152._0_8_ = 0x219392ef219392ef;
      auVar152._12_4_ = 0x219392ef;
      auVar105 = vcmpps_avx(auVar108,auVar152,1);
      auVar162._8_4_ = 0x3f800000;
      auVar162._0_8_ = 0x3f8000003f800000;
      auVar162._12_4_ = 0x3f800000;
      auVar135 = vdivps_avx(auVar162,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar108 = vandps_avx(local_36d8,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar96 = vcmpps_avx(auVar108,auVar152,1);
      auVar136 = vdivps_avx(auVar162,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar108 = vandps_avx(local_36d8,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar108 = vcmpps_avx(auVar108,auVar152,1);
      auVar137 = vdivps_avx(auVar162,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar153._8_4_ = 0x5d5e0b6b;
      auVar153._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar153._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar135,auVar153,auVar105);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar136,auVar153,auVar96)
      ;
      tray.rdir.field_0.field_0.z.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar137,auVar153,auVar108);
      auVar108 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar95,1);
      auVar135._8_4_ = 0x20;
      auVar135._0_8_ = 0x2000000020;
      auVar135._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar108,auVar135);
      auVar108 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar95,5);
      auVar105._8_4_ = 0x40;
      auVar105._0_8_ = 0x4000000040;
      auVar105._12_4_ = 0x40;
      auVar136._8_4_ = 0x60;
      auVar136._0_8_ = 0x6000000060;
      auVar136._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar136,auVar105,auVar108);
      auVar108 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar95,5);
      auVar96._8_4_ = 0x80;
      auVar96._0_8_ = 0x8000000080;
      auVar96._12_4_ = 0x80;
      auVar137._8_4_ = 0xa0;
      auVar137._0_8_ = 0xa0000000a0;
      auVar137._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar137,auVar96,auVar108);
      auVar108 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar95);
      auVar105 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar95);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar165 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar108,auVar15);
      auVar86 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar108._8_4_ = 0xff800000;
      auVar108._0_8_ = 0xff800000ff800000;
      auVar108._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar108,auVar105,auVar15);
      terminated.field_0.i[1] = auVar15._4_4_ ^ auVar120._4_4_;
      terminated.field_0.i[0] = auVar15._0_4_ ^ auVar120._0_4_;
      terminated.field_0.i[2] = auVar15._8_4_ ^ auVar120._8_4_;
      terminated.field_0.i[3] = auVar15._12_4_ ^ auVar120._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar44 = 3;
      }
      else {
        uVar44 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_38a0 = ray + 0x80;
      pNVar45 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar41 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar159 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar169 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
LAB_0163f326:
      do {
        do {
          root.ptr = pNVar45[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01640864;
          pNVar45 = pNVar45 + -1;
          paVar41 = paVar41 + -1;
          vVar5.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar41->v;
          auVar176 = ZEXT1664((undefined1  [16])vVar5.field_0);
          auVar120 = vcmpps_avx((undefined1  [16])vVar5.field_0,(undefined1  [16])tray.tfar.field_0,
                                1);
          uVar37 = vmovmskps_avx(auVar120);
        } while (uVar37 == 0);
        uVar47 = (ulong)(uVar37 & 0xff);
        uVar37 = POPCOUNT(uVar37 & 0xff);
        if (uVar44 < uVar37) {
LAB_0163f366:
          do {
            iVar39 = 4;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01640864;
              auVar120 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar176._0_16_,6);
              if ((((auVar120 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar120 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar120 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar120[0xf]) goto LAB_0163f326;
              auVar120 = vpcmpeqd_avx(auVar120,auVar120);
              lVar46 = (root.ptr & 0xfffffffffffffff0) + 0x50;
              lVar40 = 0;
              local_3888 = auVar120 ^ (undefined1  [16])terminated.field_0;
              goto LAB_0163f561;
            }
            sVar43 = 8;
            auVar120 = auVar165._0_16_;
            for (lVar40 = 0;
                (auVar176 = ZEXT1664(auVar120), lVar40 != 8 &&
                (sVar6 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar40 * 8), sVar6 != 8));
                lVar40 = lVar40 + 1) {
              uVar38 = *(undefined4 *)(root.ptr + 0x40 + lVar40 * 4);
              auVar49._4_4_ = uVar38;
              auVar49._0_4_ = uVar38;
              auVar49._8_4_ = uVar38;
              auVar49._12_4_ = uVar38;
              auVar23._8_8_ = tray.org.field_0._8_8_;
              auVar23._0_8_ = tray.org.field_0._0_8_;
              auVar24._8_8_ = tray.org.field_0._24_8_;
              auVar24._0_8_ = tray.org.field_0._16_8_;
              auVar25._8_8_ = tray.org.field_0._40_8_;
              auVar25._0_8_ = tray.org.field_0._32_8_;
              auVar108 = vsubps_avx(auVar49,auVar23);
              auVar130._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar108._0_4_;
              auVar130._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar108._4_4_;
              auVar130._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar108._8_4_;
              auVar130._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar108._12_4_;
              uVar38 = *(undefined4 *)(root.ptr + 0x80 + lVar40 * 4);
              auVar50._4_4_ = uVar38;
              auVar50._0_4_ = uVar38;
              auVar50._8_4_ = uVar38;
              auVar50._12_4_ = uVar38;
              auVar108 = vsubps_avx(auVar50,auVar24);
              auVar142._0_4_ = tray.rdir.field_0._16_4_ * auVar108._0_4_;
              auVar142._4_4_ = tray.rdir.field_0._20_4_ * auVar108._4_4_;
              auVar142._8_4_ = tray.rdir.field_0._24_4_ * auVar108._8_4_;
              auVar142._12_4_ = tray.rdir.field_0._28_4_ * auVar108._12_4_;
              uVar38 = *(undefined4 *)(root.ptr + 0xc0 + lVar40 * 4);
              auVar51._4_4_ = uVar38;
              auVar51._0_4_ = uVar38;
              auVar51._8_4_ = uVar38;
              auVar51._12_4_ = uVar38;
              auVar108 = vsubps_avx(auVar51,auVar25);
              auVar154._0_4_ = tray.rdir.field_0._32_4_ * auVar108._0_4_;
              auVar154._4_4_ = tray.rdir.field_0._36_4_ * auVar108._4_4_;
              auVar154._8_4_ = tray.rdir.field_0._40_4_ * auVar108._8_4_;
              auVar154._12_4_ = tray.rdir.field_0._44_4_ * auVar108._12_4_;
              uVar38 = *(undefined4 *)(root.ptr + 0x60 + lVar40 * 4);
              auVar52._4_4_ = uVar38;
              auVar52._0_4_ = uVar38;
              auVar52._8_4_ = uVar38;
              auVar52._12_4_ = uVar38;
              auVar108 = vsubps_avx(auVar52,auVar23);
              auVar74._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar108._0_4_;
              auVar74._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar108._4_4_;
              auVar74._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar108._8_4_;
              auVar74._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar108._12_4_;
              uVar38 = *(undefined4 *)(root.ptr + 0xa0 + lVar40 * 4);
              auVar53._4_4_ = uVar38;
              auVar53._0_4_ = uVar38;
              auVar53._8_4_ = uVar38;
              auVar53._12_4_ = uVar38;
              auVar108 = vsubps_avx(auVar53,auVar24);
              auVar87._0_4_ = tray.rdir.field_0._16_4_ * auVar108._0_4_;
              auVar87._4_4_ = tray.rdir.field_0._20_4_ * auVar108._4_4_;
              auVar87._8_4_ = tray.rdir.field_0._24_4_ * auVar108._8_4_;
              auVar87._12_4_ = tray.rdir.field_0._28_4_ * auVar108._12_4_;
              uVar38 = *(undefined4 *)(root.ptr + 0xe0 + lVar40 * 4);
              auVar54._4_4_ = uVar38;
              auVar54._0_4_ = uVar38;
              auVar54._8_4_ = uVar38;
              auVar54._12_4_ = uVar38;
              auVar108 = vsubps_avx(auVar54,auVar25);
              auVar109._0_4_ = tray.rdir.field_0._32_4_ * auVar108._0_4_;
              auVar109._4_4_ = tray.rdir.field_0._36_4_ * auVar108._4_4_;
              auVar109._8_4_ = tray.rdir.field_0._40_4_ * auVar108._8_4_;
              auVar109._12_4_ = tray.rdir.field_0._44_4_ * auVar108._12_4_;
              auVar108 = vminps_avx(auVar130,auVar74);
              auVar105 = vminps_avx(auVar142,auVar87);
              auVar108 = vmaxps_avx(auVar108,auVar105);
              auVar105 = vminps_avx(auVar154,auVar109);
              auVar108 = vmaxps_avx(auVar108,auVar105);
              auVar55._0_4_ = auVar159._0_4_ * auVar108._0_4_;
              auVar55._4_4_ = auVar159._4_4_ * auVar108._4_4_;
              auVar55._8_4_ = auVar159._8_4_ * auVar108._8_4_;
              auVar55._12_4_ = auVar159._12_4_ * auVar108._12_4_;
              auVar108 = vmaxps_avx(auVar130,auVar74);
              auVar105 = vmaxps_avx(auVar142,auVar87);
              auVar105 = vminps_avx(auVar108,auVar105);
              auVar108 = vmaxps_avx(auVar154,auVar109);
              auVar108 = vminps_avx(auVar105,auVar108);
              auVar75._0_4_ = auVar169._0_4_ * auVar108._0_4_;
              auVar75._4_4_ = auVar169._4_4_ * auVar108._4_4_;
              auVar75._8_4_ = auVar169._8_4_ * auVar108._8_4_;
              auVar75._12_4_ = auVar169._12_4_ * auVar108._12_4_;
              auVar108 = vmaxps_avx(auVar55,(undefined1  [16])tray.tnear.field_0);
              auVar105 = vminps_avx(auVar75,(undefined1  [16])tray.tfar.field_0);
              auVar105 = vcmpps_avx(auVar108,auVar105,2);
              auVar86 = ZEXT1664(auVar105);
              sVar42 = sVar43;
              auVar108 = auVar120;
              if (((((auVar105 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar105 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar105 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar105[0xf] < '\0') &&
                 (auVar108 = vblendvps_avx(auVar165._0_16_,auVar55,auVar105), sVar42 = sVar6,
                 sVar43 != 8)) {
                pNVar45->ptr = sVar43;
                pNVar45 = pNVar45 + 1;
                *(undefined1 (*) [16])paVar41->v = auVar120;
                paVar41 = paVar41 + 1;
              }
              auVar120 = auVar108;
              sVar43 = sVar42;
            }
            if (sVar43 == 8) goto LAB_0163f4f5;
            auVar108 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar120,6);
            uVar38 = vmovmskps_avx(auVar108);
            root.ptr = sVar43;
          } while ((byte)uVar44 < (byte)POPCOUNT(uVar38));
          pNVar45->ptr = sVar43;
          pNVar45 = pNVar45 + 1;
          *(undefined1 (*) [16])paVar41->v = auVar120;
          paVar41 = paVar41 + 1;
        }
        else {
          while (uVar47 != 0) {
            sVar43 = 0;
            for (uVar21 = uVar47; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
              sVar43 = sVar43 + 1;
            }
            uVar47 = uVar47 - 1 & uVar47;
            auVar86 = ZEXT1664(auVar86._0_16_);
            bVar36 = occluded1(This,bvh,root,sVar43,&pre,ray,&tray,context);
            if (bVar36) {
              *(undefined4 *)(local_3888 + sVar43 * 4 + -0x10) = 0xffffffff;
            }
          }
          auVar120 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar39 = 3;
          auVar165 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar159 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar169 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          auVar176 = ZEXT1664((undefined1  [16])vVar5.field_0);
          if ((((auVar120 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar120 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar120 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar120[0xf] < '\0') {
            auVar86 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar120._8_4_ = 0xff800000;
            auVar120._0_8_ = 0xff800000ff800000;
            auVar120._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar120,
                               (undefined1  [16])terminated.field_0);
            iVar39 = 2;
          }
          if (uVar44 < uVar37) goto LAB_0163f366;
        }
LAB_0163f4f5:
      } while (iVar39 != 3);
LAB_01640864:
      auVar15 = vandps_avx(auVar15,(undefined1  [16])terminated.field_0);
      auVar85._8_4_ = 0xff800000;
      auVar85._0_8_ = 0xff800000ff800000;
      auVar85._12_4_ = 0xff800000;
      auVar15 = vmaskmovps_avx(auVar15,auVar85);
      *(undefined1 (*) [16])local_38a0 = auVar15;
    }
  }
  return;
LAB_0163f561:
  do {
    lVar48 = -0x10;
    auVar120 = auVar86._0_16_;
    if (lVar40 == (ulong)((uint)root.ptr & 0xf) - 8) break;
    pSVar7 = context->scene;
    auVar86 = ZEXT1664(local_3888);
    do {
      auVar108 = auVar86._0_16_;
      if ((lVar48 == 0) || (iVar39 = *(int *)(lVar46 + 0x10 + lVar48), iVar39 == -1)) break;
      uVar37 = *(uint *)(lVar46 + lVar48);
      pfVar8 = (pSVar7->vertices).items[uVar37];
      uVar47 = (ulong)*(uint *)(lVar46 + -0x40 + lVar48);
      fVar1 = pfVar8[uVar47];
      auVar56._4_4_ = fVar1;
      auVar56._0_4_ = fVar1;
      auVar56._8_4_ = fVar1;
      auVar56._12_4_ = fVar1;
      fVar1 = pfVar8[uVar47 + 1];
      auVar88._4_4_ = fVar1;
      auVar88._0_4_ = fVar1;
      auVar88._8_4_ = fVar1;
      auVar88._12_4_ = fVar1;
      fVar1 = pfVar8[uVar47 + 2];
      auVar110._4_4_ = fVar1;
      auVar110._0_4_ = fVar1;
      auVar110._8_4_ = fVar1;
      auVar110._12_4_ = fVar1;
      uVar47 = (ulong)*(uint *)(lVar46 + -0x10 + lVar48);
      fVar1 = pfVar8[uVar47];
      auVar76._4_4_ = fVar1;
      auVar76._0_4_ = fVar1;
      auVar76._8_4_ = fVar1;
      auVar76._12_4_ = fVar1;
      fVar1 = pfVar8[uVar47 + 1];
      auVar131._4_4_ = fVar1;
      auVar131._0_4_ = fVar1;
      auVar131._8_4_ = fVar1;
      auVar131._12_4_ = fVar1;
      fVar1 = pfVar8[uVar47 + 2];
      auVar138._4_4_ = fVar1;
      auVar138._0_4_ = fVar1;
      auVar138._8_4_ = fVar1;
      auVar138._12_4_ = fVar1;
      auVar120 = *(undefined1 (*) [16])ray;
      auVar105 = *(undefined1 (*) [16])(ray + 0x10);
      auVar95 = *(undefined1 (*) [16])(ray + 0x20);
      auVar136 = vsubps_avx(auVar56,auVar120);
      auVar137 = vsubps_avx(auVar88,auVar105);
      auVar152 = vsubps_avx(auVar110,auVar95);
      auVar153 = vsubps_avx(auVar131,auVar105);
      auVar162 = vsubps_avx(auVar138,auVar95);
      auVar56 = vsubps_avx(auVar153,auVar137);
      auVar88 = vsubps_avx(auVar162,auVar152);
      auVar155._0_4_ = auVar153._0_4_ + auVar137._0_4_;
      auVar155._4_4_ = auVar153._4_4_ + auVar137._4_4_;
      auVar155._8_4_ = auVar153._8_4_ + auVar137._8_4_;
      auVar155._12_4_ = auVar153._12_4_ + auVar137._12_4_;
      fVar11 = auVar152._0_4_;
      auVar160._0_4_ = auVar162._0_4_ + fVar11;
      fVar12 = auVar152._4_4_;
      auVar160._4_4_ = auVar162._4_4_ + fVar12;
      fVar13 = auVar152._8_4_;
      auVar160._8_4_ = auVar162._8_4_ + fVar13;
      fVar14 = auVar152._12_4_;
      auVar160._12_4_ = auVar162._12_4_ + fVar14;
      auVar167._0_4_ = auVar155._0_4_ * auVar88._0_4_;
      auVar167._4_4_ = auVar155._4_4_ * auVar88._4_4_;
      auVar167._8_4_ = auVar155._8_4_ * auVar88._8_4_;
      auVar167._12_4_ = auVar155._12_4_ * auVar88._12_4_;
      auVar163 = vfmsub231ps_fma(auVar167,auVar56,auVar160);
      auVar110 = vsubps_avx(auVar76,auVar120);
      auVar167 = vsubps_avx(auVar110,auVar136);
      auVar161._0_4_ = auVar160._0_4_ * auVar167._0_4_;
      auVar161._4_4_ = auVar160._4_4_ * auVar167._4_4_;
      auVar161._8_4_ = auVar160._8_4_ * auVar167._8_4_;
      auVar161._12_4_ = auVar160._12_4_ * auVar167._12_4_;
      auVar174._0_4_ = auVar110._0_4_ + auVar136._0_4_;
      auVar174._4_4_ = auVar110._4_4_ + auVar136._4_4_;
      auVar174._8_4_ = auVar110._8_4_ + auVar136._8_4_;
      auVar174._12_4_ = auVar110._12_4_ + auVar136._12_4_;
      auVar135 = vfmsub231ps_fma(auVar161,auVar88,auVar174);
      auVar175._0_4_ = auVar174._0_4_ * auVar56._0_4_;
      auVar175._4_4_ = auVar174._4_4_ * auVar56._4_4_;
      auVar175._8_4_ = auVar174._8_4_ * auVar56._8_4_;
      auVar175._12_4_ = auVar174._12_4_ * auVar56._12_4_;
      auVar96 = vfmsub231ps_fma(auVar175,auVar167,auVar155);
      fVar2 = *(float *)(ray + 0x60);
      fVar3 = *(float *)(ray + 100);
      fVar20 = *(float *)(ray + 0x68);
      auVar31 = *(undefined1 (*) [12])(ray + 0x60);
      fVar22 = *(float *)(ray + 0x6c);
      auVar156._0_4_ = auVar96._0_4_ * fVar2;
      auVar156._4_4_ = auVar96._4_4_ * fVar3;
      auVar156._8_4_ = auVar96._8_4_ * fVar20;
      auVar156._12_4_ = auVar96._12_4_ * fVar22;
      auVar96 = *(undefined1 (*) [16])(ray + 0x50);
      auVar155 = vfmadd231ps_fma(auVar156,auVar96,auVar135);
      auVar135 = *(undefined1 (*) [16])(ray + 0x40);
      auVar156 = vfmadd231ps_fma(auVar155,auVar135,auVar163);
      uVar47 = (ulong)*(uint *)(lVar46 + -0x30 + lVar48);
      fVar1 = pfVar8[uVar47];
      auVar77._4_4_ = fVar1;
      auVar77._0_4_ = fVar1;
      auVar77._8_4_ = fVar1;
      auVar77._12_4_ = fVar1;
      auVar120 = vsubps_avx(auVar77,auVar120);
      fVar1 = pfVar8[uVar47 + 1];
      auVar89._4_4_ = fVar1;
      auVar89._0_4_ = fVar1;
      auVar89._8_4_ = fVar1;
      auVar89._12_4_ = fVar1;
      auVar105 = vsubps_avx(auVar89,auVar105);
      fVar1 = pfVar8[uVar47 + 2];
      auVar132._4_4_ = fVar1;
      auVar132._0_4_ = fVar1;
      auVar132._8_4_ = fVar1;
      auVar132._12_4_ = fVar1;
      auVar95 = vsubps_avx(auVar132,auVar95);
      auVar155 = vsubps_avx(auVar137,auVar105);
      auVar152 = vsubps_avx(auVar152,auVar95);
      auVar123._0_4_ = auVar137._0_4_ + auVar105._0_4_;
      auVar123._4_4_ = auVar137._4_4_ + auVar105._4_4_;
      auVar123._8_4_ = auVar137._8_4_ + auVar105._8_4_;
      auVar123._12_4_ = auVar137._12_4_ + auVar105._12_4_;
      auVar145._0_4_ = fVar11 + auVar95._0_4_;
      auVar145._4_4_ = fVar12 + auVar95._4_4_;
      auVar145._8_4_ = fVar13 + auVar95._8_4_;
      auVar145._12_4_ = fVar14 + auVar95._12_4_;
      fVar173 = auVar152._0_4_;
      auVar163._0_4_ = fVar173 * auVar123._0_4_;
      fVar177 = auVar152._4_4_;
      auVar163._4_4_ = fVar177 * auVar123._4_4_;
      fVar178 = auVar152._8_4_;
      auVar163._8_4_ = fVar178 * auVar123._8_4_;
      fVar179 = auVar152._12_4_;
      auVar163._12_4_ = fVar179 * auVar123._12_4_;
      auVar160 = vfmsub231ps_fma(auVar163,auVar155,auVar145);
      auVar163 = vsubps_avx(auVar136,auVar120);
      fVar16 = auVar163._0_4_;
      auVar146._0_4_ = auVar145._0_4_ * fVar16;
      fVar17 = auVar163._4_4_;
      auVar146._4_4_ = auVar145._4_4_ * fVar17;
      fVar18 = auVar163._8_4_;
      auVar146._8_4_ = auVar145._8_4_ * fVar18;
      fVar19 = auVar163._12_4_;
      auVar146._12_4_ = auVar145._12_4_ * fVar19;
      auVar139._0_4_ = auVar136._0_4_ + auVar120._0_4_;
      auVar139._4_4_ = auVar136._4_4_ + auVar120._4_4_;
      auVar139._8_4_ = auVar136._8_4_ + auVar120._8_4_;
      auVar139._12_4_ = auVar136._12_4_ + auVar120._12_4_;
      auVar145 = vfmsub231ps_fma(auVar146,auVar152,auVar139);
      fVar166 = auVar155._0_4_;
      auVar140._0_4_ = fVar166 * auVar139._0_4_;
      fVar170 = auVar155._4_4_;
      auVar140._4_4_ = fVar170 * auVar139._4_4_;
      fVar171 = auVar155._8_4_;
      auVar140._8_4_ = fVar171 * auVar139._8_4_;
      fVar172 = auVar155._12_4_;
      auVar140._12_4_ = fVar172 * auVar139._12_4_;
      auVar57 = vfmsub231ps_fma(auVar140,auVar163,auVar123);
      auVar124._0_4_ = fVar2 * auVar57._0_4_;
      auVar124._4_4_ = fVar3 * auVar57._4_4_;
      auVar124._8_4_ = fVar20 * auVar57._8_4_;
      auVar124._12_4_ = fVar22 * auVar57._12_4_;
      auVar145 = vfmadd231ps_fma(auVar124,auVar96,auVar145);
      auVar160 = vfmadd231ps_fma(auVar145,auVar135,auVar160);
      auVar145 = vsubps_avx(auVar120,auVar110);
      auVar57._0_4_ = auVar120._0_4_ + auVar110._0_4_;
      auVar57._4_4_ = auVar120._4_4_ + auVar110._4_4_;
      auVar57._8_4_ = auVar120._8_4_ + auVar110._8_4_;
      auVar57._12_4_ = auVar120._12_4_ + auVar110._12_4_;
      auVar110 = vsubps_avx(auVar105,auVar153);
      auVar78._0_4_ = auVar153._0_4_ + auVar105._0_4_;
      auVar78._4_4_ = auVar153._4_4_ + auVar105._4_4_;
      auVar78._8_4_ = auVar153._8_4_ + auVar105._8_4_;
      auVar78._12_4_ = auVar153._12_4_ + auVar105._12_4_;
      auVar153 = vsubps_avx(auVar95,auVar162);
      auVar90._0_4_ = auVar95._0_4_ + auVar162._0_4_;
      auVar90._4_4_ = auVar95._4_4_ + auVar162._4_4_;
      auVar90._8_4_ = auVar95._8_4_ + auVar162._8_4_;
      auVar90._12_4_ = auVar95._12_4_ + auVar162._12_4_;
      auVar111._0_4_ = auVar153._0_4_ * auVar78._0_4_;
      auVar111._4_4_ = auVar153._4_4_ * auVar78._4_4_;
      auVar111._8_4_ = auVar153._8_4_ * auVar78._8_4_;
      auVar111._12_4_ = auVar153._12_4_ * auVar78._12_4_;
      auVar105 = vfmsub231ps_fma(auVar111,auVar110,auVar90);
      auVar91._0_4_ = auVar145._0_4_ * auVar90._0_4_;
      auVar91._4_4_ = auVar145._4_4_ * auVar90._4_4_;
      auVar91._8_4_ = auVar145._8_4_ * auVar90._8_4_;
      auVar91._12_4_ = auVar145._12_4_ * auVar90._12_4_;
      auVar120 = vfmsub231ps_fma(auVar91,auVar153,auVar57);
      auVar95._0_4_ = auVar110._0_4_ * auVar57._0_4_;
      auVar95._4_4_ = auVar110._4_4_ * auVar57._4_4_;
      auVar95._8_4_ = auVar110._8_4_ * auVar57._8_4_;
      auVar95._12_4_ = auVar110._12_4_ * auVar57._12_4_;
      auVar95 = vfmsub231ps_fma(auVar95,auVar145,auVar78);
      auVar58._0_4_ = fVar2 * auVar95._0_4_;
      auVar58._4_4_ = fVar3 * auVar95._4_4_;
      auVar58._8_4_ = fVar20 * auVar95._8_4_;
      auVar58._12_4_ = fVar22 * auVar95._12_4_;
      auVar120 = vfmadd231ps_fma(auVar58,auVar96,auVar120);
      auVar162 = vfmadd231ps_fma(auVar120,auVar135,auVar105);
      auVar133._0_4_ = auVar162._0_4_ + auVar156._0_4_ + auVar160._0_4_;
      auVar133._4_4_ = auVar162._4_4_ + auVar156._4_4_ + auVar160._4_4_;
      auVar133._8_4_ = auVar162._8_4_ + auVar156._8_4_ + auVar160._8_4_;
      auVar133._12_4_ = auVar162._12_4_ + auVar156._12_4_ + auVar160._12_4_;
      auVar120 = vminps_avx(auVar156,auVar160);
      auVar105 = vminps_avx(auVar120,auVar162);
      auVar120 = vandps_avx(auVar133,local_36d8);
      auVar92._0_4_ = auVar120._0_4_ * 1.1920929e-07;
      auVar92._4_4_ = auVar120._4_4_ * 1.1920929e-07;
      auVar92._8_4_ = auVar120._8_4_ * 1.1920929e-07;
      auVar92._12_4_ = auVar120._12_4_ * 1.1920929e-07;
      uVar47 = CONCAT44(auVar92._4_4_,auVar92._0_4_);
      auVar112._0_8_ = uVar47 ^ 0x8000000080000000;
      auVar112._8_4_ = -auVar92._8_4_;
      auVar112._12_4_ = -auVar92._12_4_;
      auVar105 = vcmpps_avx(auVar105,auVar112,5);
      auVar95 = vmaxps_avx(auVar156,auVar160);
      auVar95 = vmaxps_avx(auVar95,auVar162);
      auVar95 = vcmpps_avx(auVar95,auVar92,2);
      auVar105 = vorps_avx(auVar105,auVar95);
      uVar47 = (ulong)*(uint *)(lVar46 + -0x20 + lVar48);
      auVar95 = auVar108 & auVar105;
      fVar1 = pfVar8[uVar47];
      fVar2 = pfVar8[uVar47 + 1];
      fVar3 = pfVar8[uVar47 + 2];
      if ((((auVar95 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar95 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar95 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar95[0xf])
      {
        auVar165 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar159 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar169 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      }
      else {
        auVar59._0_4_ = fVar166 * auVar88._0_4_;
        auVar59._4_4_ = fVar170 * auVar88._4_4_;
        auVar59._8_4_ = fVar171 * auVar88._8_4_;
        auVar59._12_4_ = fVar172 * auVar88._12_4_;
        auVar79._0_4_ = fVar16 * auVar56._0_4_;
        auVar79._4_4_ = fVar17 * auVar56._4_4_;
        auVar79._8_4_ = fVar18 * auVar56._8_4_;
        auVar79._12_4_ = fVar19 * auVar56._12_4_;
        auVar162 = vfmsub213ps_fma(auVar56,auVar152,auVar59);
        auVar93._0_4_ = auVar110._0_4_ * fVar173;
        auVar93._4_4_ = auVar110._4_4_ * fVar177;
        auVar93._8_4_ = auVar110._8_4_ * fVar178;
        auVar93._12_4_ = auVar110._12_4_ * fVar179;
        auVar113._0_4_ = fVar16 * auVar153._0_4_;
        auVar113._4_4_ = fVar17 * auVar153._4_4_;
        auVar113._8_4_ = fVar18 * auVar153._8_4_;
        auVar113._12_4_ = fVar19 * auVar153._12_4_;
        auVar56 = vfmsub213ps_fma(auVar153,auVar155,auVar93);
        auVar95 = vandps_avx(auVar59,local_36d8);
        auVar153 = vandps_avx(auVar93,local_36d8);
        auVar95 = vcmpps_avx(auVar95,auVar153,1);
        local_3768.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar56,auVar162,auVar95);
        auVar60._0_4_ = auVar145._0_4_ * fVar166;
        auVar60._4_4_ = auVar145._4_4_ * fVar170;
        auVar60._8_4_ = auVar145._8_4_ * fVar171;
        auVar60._12_4_ = auVar145._12_4_ * fVar172;
        auVar153 = vfmsub213ps_fma(auVar145,auVar152,auVar113);
        auVar94._0_4_ = fVar173 * auVar167._0_4_;
        auVar94._4_4_ = fVar177 * auVar167._4_4_;
        auVar94._8_4_ = fVar178 * auVar167._8_4_;
        auVar94._12_4_ = fVar179 * auVar167._12_4_;
        auVar162 = vfmsub213ps_fma(auVar88,auVar163,auVar94);
        auVar95 = vandps_avx(auVar94,local_36d8);
        auVar152 = vandps_avx(auVar113,local_36d8);
        auVar95 = vcmpps_avx(auVar95,auVar152,1);
        local_3768.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar153,auVar162,auVar95);
        auVar153 = vfmsub213ps_fma(auVar167,auVar155,auVar79);
        auVar162 = vfmsub213ps_fma(auVar110,auVar163,auVar60);
        auVar95 = vandps_avx(auVar79,local_36d8);
        auVar152 = vandps_avx(auVar60,local_36d8);
        auVar95 = vcmpps_avx(auVar95,auVar152,1);
        local_3768.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar162,auVar153,auVar95);
        local_3828 = auVar31._0_4_;
        fStack_3824 = auVar31._4_4_;
        fStack_3820 = auVar31._8_4_;
        auVar61._0_4_ = local_3768._32_4_ * local_3828;
        auVar61._4_4_ = local_3768._36_4_ * fStack_3824;
        auVar61._8_4_ = local_3768._40_4_ * fStack_3820;
        auVar61._12_4_ = local_3768._44_4_ * fVar22;
        auVar95 = vfmadd213ps_fma(auVar96,(undefined1  [16])local_3768.field_0.y.field_0,auVar61);
        auVar95 = vfmadd213ps_fma(auVar135,(undefined1  [16])local_3768.field_0.x.field_0,auVar95);
        auVar62._0_4_ = auVar95._0_4_ + auVar95._0_4_;
        auVar62._4_4_ = auVar95._4_4_ + auVar95._4_4_;
        auVar62._8_4_ = auVar95._8_4_ + auVar95._8_4_;
        auVar62._12_4_ = auVar95._12_4_ + auVar95._12_4_;
        auVar80._0_4_ = local_3768._32_4_ * fVar11;
        auVar80._4_4_ = local_3768._36_4_ * fVar12;
        auVar80._8_4_ = local_3768._40_4_ * fVar13;
        auVar80._12_4_ = local_3768._44_4_ * fVar14;
        auVar95 = vfmadd213ps_fma(auVar137,(undefined1  [16])local_3768.field_0.y.field_0,auVar80);
        auVar96 = vfmadd213ps_fma(auVar136,(undefined1  [16])local_3768.field_0.x.field_0,auVar95);
        auVar95 = vrcpps_avx(auVar62);
        auVar147._8_4_ = 0x3f800000;
        auVar147._0_8_ = 0x3f8000003f800000;
        auVar147._12_4_ = 0x3f800000;
        auVar135 = vfnmadd213ps_fma(auVar95,auVar62,auVar147);
        auVar95 = vfmadd132ps_fma(auVar135,auVar95,auVar95);
        local_3738._0_4_ = (auVar96._0_4_ + auVar96._0_4_) * auVar95._0_4_;
        local_3738._4_4_ = (auVar96._4_4_ + auVar96._4_4_) * auVar95._4_4_;
        local_3738._8_4_ = (auVar96._8_4_ + auVar96._8_4_) * auVar95._8_4_;
        local_3738._12_4_ = (auVar96._12_4_ + auVar96._12_4_) * auVar95._12_4_;
        auVar95 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),local_3738,2);
        auVar96 = vcmpps_avx(local_3738,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar95 = vandps_avx(auVar95,auVar96);
        uVar47 = CONCAT44(auVar62._4_4_,auVar62._0_4_);
        auVar114._0_8_ = uVar47 ^ 0x8000000080000000;
        auVar114._8_4_ = -auVar62._8_4_;
        auVar114._12_4_ = -auVar62._12_4_;
        auVar96 = vcmpps_avx(auVar62,auVar114,4);
        auVar95 = vandps_avx(auVar96,auVar95);
        auVar105 = vandps_avx(auVar108,auVar105);
        auVar95 = vpslld_avx(auVar95,0x1f);
        auVar96 = vpsrad_avx(auVar95,0x1f);
        auVar95 = auVar105 & auVar96;
        if ((((auVar95 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar95 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar95 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar95[0xf]
           ) {
          auVar165 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar159 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar169 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        }
        else {
          auVar105 = vandps_avx(auVar96,auVar105);
          pGVar9 = (context->scene->geometries).items[uVar37].ptr;
          uVar4 = pGVar9->mask;
          auVar97._4_4_ = uVar4;
          auVar97._0_4_ = uVar4;
          auVar97._8_4_ = uVar4;
          auVar97._12_4_ = uVar4;
          auVar95 = vpand_avx(auVar97,*(undefined1 (*) [16])(ray + 0x90));
          auVar95 = vpcmpeqd_avx(auVar95,_DAT_01f45a50);
          auVar96 = auVar105 & ~auVar95;
          auVar165 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar159 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar169 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          if ((((auVar96 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar96 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar96 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar96[0xf] < '\0') {
            auVar105 = vandnps_avx(auVar95,auVar105);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar95 = vrcpps_avx(auVar133);
              auVar151._8_4_ = 0x3f800000;
              auVar151._0_8_ = 0x3f8000003f800000;
              auVar151._12_4_ = 0x3f800000;
              auVar96 = vfnmadd213ps_fma(auVar133,auVar95,auVar151);
              auVar95 = vfmadd132ps_fma(auVar96,auVar95,auVar95);
              auVar69._8_4_ = 0x219392ef;
              auVar69._0_8_ = 0x219392ef219392ef;
              auVar69._12_4_ = 0x219392ef;
              auVar120 = vcmpps_avx(auVar120,auVar69,5);
              auVar120 = vandps_avx(auVar120,auVar95);
              auVar103._0_4_ = auVar120._0_4_ * auVar156._0_4_;
              auVar103._4_4_ = auVar120._4_4_ * auVar156._4_4_;
              auVar103._8_4_ = auVar120._8_4_ * auVar156._8_4_;
              auVar103._12_4_ = auVar120._12_4_ * auVar156._12_4_;
              auVar95 = vminps_avx(auVar103,auVar151);
              auVar70._0_4_ = auVar160._0_4_ * auVar120._0_4_;
              auVar70._4_4_ = auVar160._4_4_ * auVar120._4_4_;
              auVar70._8_4_ = auVar160._8_4_ * auVar120._8_4_;
              auVar70._12_4_ = auVar160._12_4_ * auVar120._12_4_;
              auVar120 = vminps_avx(auVar70,auVar151);
              auVar96 = vsubps_avx(auVar151,auVar95);
              auVar135 = vsubps_avx(auVar151,auVar120);
              auVar27._8_8_ = uVar33;
              auVar27._0_8_ = uVar32;
              local_3718 = vblendvps_avx(auVar95,auVar96,auVar27);
              local_3728 = vblendvps_avx(auVar120,auVar135,auVar27);
              args.valid = (int *)&Ng;
              args.geometryUserPtr = &t;
              args.context = (RTCRayQueryContext *)&v;
              args.ray = (RTCRayN *)&u;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
              ::
              _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                          *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                   *)&local_3768.field_0);
              local_3708._4_4_ = uVar37;
              local_3708._0_4_ = uVar37;
              local_3708._8_4_ = uVar37;
              local_3708._12_4_ = uVar37;
              local_3718._4_4_ = iVar39;
              local_3718._0_4_ = iVar39;
              local_3718._8_4_ = iVar39;
              local_3718._12_4_ = iVar39;
              vpcmpeqd_avx2(ZEXT1632(local_3708),ZEXT1632(local_3708));
              uStack_36f4 = context->user->instID[0];
              local_36f8 = uStack_36f4;
              uStack_36f0 = uStack_36f4;
              uStack_36ec = uStack_36f4;
              uStack_36e8 = context->user->instPrimID[0];
              uStack_36e4 = uStack_36e8;
              uStack_36e0 = uStack_36e8;
              uStack_36dc = uStack_36e8;
              auVar120 = *(undefined1 (*) [16])(ray + 0x80);
              auVar95 = vblendvps_avx(auVar120,(undefined1  [16])t.field_0,auVar105);
              *(undefined1 (*) [16])(ray + 0x80) = auVar95;
              args.valid = (int *)local_38b8;
              args.geometryUserPtr = pGVar9->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)&local_3768;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              local_38b8 = auVar105;
              if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar9->occlusionFilterN)(&args);
              }
              if (local_38b8 == (undefined1  [16])0x0) {
                auVar105 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar105 = auVar105 ^ _DAT_01f46b70;
                auVar165 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar159 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                auVar169 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              }
              else {
                p_Var10 = context->args->filter;
                if (p_Var10 == (RTCFilterFunctionN)0x0) {
                  auVar165 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                  auVar159 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)))
                  ;
                  auVar169 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)))
                  ;
                }
                else {
                  auVar165 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                  auVar159 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)))
                  ;
                  auVar169 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)))
                  ;
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar9->field_8).field_0x2 & 0x40) != 0)
                     ) {
                    (*p_Var10)(&args);
                    auVar169 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)
                                                 ));
                    auVar159 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)
                                                 ));
                    auVar165 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                 ));
                  }
                }
                auVar95 = vpcmpeqd_avx(local_38b8,_DAT_01f45a50);
                auVar105 = auVar95 ^ _DAT_01f46b70;
                auVar104._8_4_ = 0xff800000;
                auVar104._0_8_ = 0xff800000ff800000;
                auVar104._12_4_ = 0xff800000;
                auVar95 = vblendvps_avx(auVar104,*(undefined1 (*) [16])(args.ray + 0x80),auVar95);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar95;
              }
              auVar95 = vpslld_avx(auVar105,0x1f);
              auVar105 = vpsrad_avx(auVar95,0x1f);
              auVar120 = vblendvps_avx(auVar120,*(undefined1 (*) [16])local_38a0,auVar95);
              *(undefined1 (*) [16])local_38a0 = auVar120;
            }
            auVar108 = vpandn_avx(auVar105,auVar108);
          }
        }
      }
      if ((((auVar108 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar108 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar108 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar108[0xf]
         ) break;
      auVar120 = *(undefined1 (*) [16])ray;
      auVar105 = *(undefined1 (*) [16])(ray + 0x10);
      auVar95 = *(undefined1 (*) [16])(ray + 0x20);
      auVar30._4_4_ = fVar1;
      auVar30._0_4_ = fVar1;
      auVar30._8_4_ = fVar1;
      auVar30._12_4_ = fVar1;
      auVar136 = vsubps_avx(auVar30,auVar120);
      auVar29._4_4_ = fVar2;
      auVar29._0_4_ = fVar2;
      auVar29._8_4_ = fVar2;
      auVar29._12_4_ = fVar2;
      auVar137 = vsubps_avx(auVar29,auVar105);
      auVar28._4_4_ = fVar3;
      auVar28._0_4_ = fVar3;
      auVar28._8_4_ = fVar3;
      auVar28._12_4_ = fVar3;
      auVar96 = vsubps_avx(auVar28,auVar95);
      auVar135 = vsubps_avx(auVar76,auVar120);
      auVar152 = vsubps_avx(auVar131,auVar105);
      auVar153 = vsubps_avx(auVar138,auVar95);
      auVar162 = vsubps_avx(auVar77,auVar120);
      auVar56 = vsubps_avx(auVar89,auVar105);
      auVar95 = vsubps_avx(auVar132,auVar95);
      auVar88 = vsubps_avx(auVar162,auVar136);
      auVar110 = vsubps_avx(auVar56,auVar137);
      auVar167 = vsubps_avx(auVar95,auVar96);
      auVar81._0_4_ = auVar136._0_4_ + auVar162._0_4_;
      auVar81._4_4_ = auVar136._4_4_ + auVar162._4_4_;
      auVar81._8_4_ = auVar136._8_4_ + auVar162._8_4_;
      auVar81._12_4_ = auVar136._12_4_ + auVar162._12_4_;
      auVar148._0_4_ = auVar56._0_4_ + auVar137._0_4_;
      auVar148._4_4_ = auVar56._4_4_ + auVar137._4_4_;
      auVar148._8_4_ = auVar56._8_4_ + auVar137._8_4_;
      auVar148._12_4_ = auVar56._12_4_ + auVar137._12_4_;
      fVar1 = auVar96._0_4_;
      auVar158._0_4_ = auVar95._0_4_ + fVar1;
      fVar2 = auVar96._4_4_;
      auVar158._4_4_ = auVar95._4_4_ + fVar2;
      fVar3 = auVar96._8_4_;
      auVar158._8_4_ = auVar95._8_4_ + fVar3;
      fVar11 = auVar96._12_4_;
      auVar158._12_4_ = auVar95._12_4_ + fVar11;
      auVar168._0_4_ = auVar148._0_4_ * auVar167._0_4_;
      auVar168._4_4_ = auVar148._4_4_ * auVar167._4_4_;
      auVar168._8_4_ = auVar148._8_4_ * auVar167._8_4_;
      auVar168._12_4_ = auVar148._12_4_ * auVar167._12_4_;
      auVar163 = vfmsub231ps_fma(auVar168,auVar110,auVar158);
      auVar164._0_4_ = auVar158._0_4_ * auVar88._0_4_;
      auVar164._4_4_ = auVar158._4_4_ * auVar88._4_4_;
      auVar164._8_4_ = auVar158._8_4_ * auVar88._8_4_;
      auVar164._12_4_ = auVar158._12_4_ * auVar88._12_4_;
      auVar105 = vfmsub231ps_fma(auVar164,auVar167,auVar81);
      auVar82._0_4_ = auVar81._0_4_ * auVar110._0_4_;
      auVar82._4_4_ = auVar81._4_4_ * auVar110._4_4_;
      auVar82._8_4_ = auVar81._8_4_ * auVar110._8_4_;
      auVar82._12_4_ = auVar81._12_4_ * auVar110._12_4_;
      auVar120 = vfmsub231ps_fma(auVar82,auVar88,auVar148);
      fVar22 = *(float *)(ray + 0x60);
      fVar166 = *(float *)(ray + 100);
      fVar170 = *(float *)(ray + 0x68);
      auVar31 = *(undefined1 (*) [12])(ray + 0x60);
      fVar171 = *(float *)(ray + 0x6c);
      auVar157._0_4_ = auVar120._0_4_ * fVar22;
      auVar157._4_4_ = auVar120._4_4_ * fVar166;
      auVar157._8_4_ = auVar120._8_4_ * fVar170;
      auVar157._12_4_ = auVar120._12_4_ * fVar171;
      auVar120 = *(undefined1 (*) [16])(ray + 0x50);
      auVar155 = vfmadd231ps_fma(auVar157,auVar120,auVar105);
      auVar105 = *(undefined1 (*) [16])(ray + 0x40);
      auVar160 = vfmadd231ps_fma(auVar155,auVar105,auVar163);
      auVar155 = vsubps_avx(auVar137,auVar152);
      auVar163 = vsubps_avx(auVar96,auVar153);
      auVar83._0_4_ = auVar152._0_4_ + auVar137._0_4_;
      auVar83._4_4_ = auVar152._4_4_ + auVar137._4_4_;
      auVar83._8_4_ = auVar152._8_4_ + auVar137._8_4_;
      auVar83._12_4_ = auVar152._12_4_ + auVar137._12_4_;
      auVar149._0_4_ = fVar1 + auVar153._0_4_;
      auVar149._4_4_ = fVar2 + auVar153._4_4_;
      auVar149._8_4_ = fVar3 + auVar153._8_4_;
      auVar149._12_4_ = fVar11 + auVar153._12_4_;
      fVar172 = auVar163._0_4_;
      auVar115._0_4_ = fVar172 * auVar83._0_4_;
      fVar173 = auVar163._4_4_;
      auVar115._4_4_ = fVar173 * auVar83._4_4_;
      fVar177 = auVar163._8_4_;
      auVar115._8_4_ = fVar177 * auVar83._8_4_;
      fVar178 = auVar163._12_4_;
      auVar115._12_4_ = fVar178 * auVar83._12_4_;
      auVar156 = vfmsub231ps_fma(auVar115,auVar155,auVar149);
      auVar145 = vsubps_avx(auVar136,auVar135);
      fVar12 = auVar145._0_4_;
      auVar150._0_4_ = auVar149._0_4_ * fVar12;
      fVar14 = auVar145._4_4_;
      auVar150._4_4_ = auVar149._4_4_ * fVar14;
      fVar17 = auVar145._8_4_;
      auVar150._8_4_ = auVar149._8_4_ * fVar17;
      fVar19 = auVar145._12_4_;
      auVar150._12_4_ = auVar149._12_4_ * fVar19;
      auVar143._0_4_ = auVar136._0_4_ + auVar135._0_4_;
      auVar143._4_4_ = auVar136._4_4_ + auVar135._4_4_;
      auVar143._8_4_ = auVar136._8_4_ + auVar135._8_4_;
      auVar143._12_4_ = auVar136._12_4_ + auVar135._12_4_;
      auVar96 = vfmsub231ps_fma(auVar150,auVar163,auVar143);
      fVar13 = auVar155._0_4_;
      auVar144._0_4_ = auVar143._0_4_ * fVar13;
      fVar16 = auVar155._4_4_;
      auVar144._4_4_ = auVar143._4_4_ * fVar16;
      fVar18 = auVar155._8_4_;
      auVar144._8_4_ = auVar143._8_4_ * fVar18;
      fVar20 = auVar155._12_4_;
      auVar144._12_4_ = auVar143._12_4_ * fVar20;
      auVar57 = vfmsub231ps_fma(auVar144,auVar145,auVar83);
      auVar84._0_4_ = auVar57._0_4_ * fVar22;
      auVar84._4_4_ = auVar57._4_4_ * fVar166;
      auVar84._8_4_ = auVar57._8_4_ * fVar170;
      auVar84._12_4_ = auVar57._12_4_ * fVar171;
      auVar96 = vfmadd231ps_fma(auVar84,auVar120,auVar96);
      auVar57 = vfmadd231ps_fma(auVar96,auVar105,auVar156);
      auVar156 = vsubps_avx(auVar135,auVar162);
      auVar98._0_4_ = auVar135._0_4_ + auVar162._0_4_;
      auVar98._4_4_ = auVar135._4_4_ + auVar162._4_4_;
      auVar98._8_4_ = auVar135._8_4_ + auVar162._8_4_;
      auVar98._12_4_ = auVar135._12_4_ + auVar162._12_4_;
      auVar162 = vsubps_avx(auVar152,auVar56);
      auVar116._0_4_ = auVar152._0_4_ + auVar56._0_4_;
      auVar116._4_4_ = auVar152._4_4_ + auVar56._4_4_;
      auVar116._8_4_ = auVar152._8_4_ + auVar56._8_4_;
      auVar116._12_4_ = auVar152._12_4_ + auVar56._12_4_;
      auVar152 = vsubps_avx(auVar153,auVar95);
      auVar63._0_4_ = auVar153._0_4_ + auVar95._0_4_;
      auVar63._4_4_ = auVar153._4_4_ + auVar95._4_4_;
      auVar63._8_4_ = auVar153._8_4_ + auVar95._8_4_;
      auVar63._12_4_ = auVar153._12_4_ + auVar95._12_4_;
      auVar125._0_4_ = auVar152._0_4_ * auVar116._0_4_;
      auVar125._4_4_ = auVar152._4_4_ * auVar116._4_4_;
      auVar125._8_4_ = auVar152._8_4_ * auVar116._8_4_;
      auVar125._12_4_ = auVar152._12_4_ * auVar116._12_4_;
      auVar96 = vfmsub231ps_fma(auVar125,auVar162,auVar63);
      auVar64._0_4_ = auVar156._0_4_ * auVar63._0_4_;
      auVar64._4_4_ = auVar156._4_4_ * auVar63._4_4_;
      auVar64._8_4_ = auVar156._8_4_ * auVar63._8_4_;
      auVar64._12_4_ = auVar156._12_4_ * auVar63._12_4_;
      auVar95 = vfmsub231ps_fma(auVar64,auVar152,auVar98);
      auVar99._0_4_ = auVar98._0_4_ * auVar162._0_4_;
      auVar99._4_4_ = auVar98._4_4_ * auVar162._4_4_;
      auVar99._8_4_ = auVar98._8_4_ * auVar162._8_4_;
      auVar99._12_4_ = auVar98._12_4_ * auVar162._12_4_;
      auVar135 = vfmsub231ps_fma(auVar99,auVar156,auVar116);
      auVar100._0_4_ = auVar135._0_4_ * fVar22;
      auVar100._4_4_ = auVar135._4_4_ * fVar166;
      auVar100._8_4_ = auVar135._8_4_ * fVar170;
      auVar100._12_4_ = auVar135._12_4_ * fVar171;
      auVar95 = vfmadd231ps_fma(auVar100,auVar120,auVar95);
      auVar153 = vfmadd231ps_fma(auVar95,auVar105,auVar96);
      auVar134._0_4_ = auVar153._0_4_ + auVar160._0_4_ + auVar57._0_4_;
      auVar134._4_4_ = auVar153._4_4_ + auVar160._4_4_ + auVar57._4_4_;
      auVar134._8_4_ = auVar153._8_4_ + auVar160._8_4_ + auVar57._8_4_;
      auVar134._12_4_ = auVar153._12_4_ + auVar160._12_4_ + auVar57._12_4_;
      auVar95 = vminps_avx(auVar160,auVar57);
      auVar96 = vminps_avx(auVar95,auVar153);
      auVar95 = vandps_avx(auVar134,local_36d8);
      auVar117._0_4_ = auVar95._0_4_ * 1.1920929e-07;
      auVar117._4_4_ = auVar95._4_4_ * 1.1920929e-07;
      auVar117._8_4_ = auVar95._8_4_ * 1.1920929e-07;
      auVar117._12_4_ = auVar95._12_4_ * 1.1920929e-07;
      uVar47 = CONCAT44(auVar117._4_4_,auVar117._0_4_);
      auVar126._0_8_ = uVar47 ^ 0x8000000080000000;
      auVar126._8_4_ = -auVar117._8_4_;
      auVar126._12_4_ = -auVar117._12_4_;
      auVar96 = vcmpps_avx(auVar96,auVar126,5);
      auVar135 = vmaxps_avx(auVar160,auVar57);
      auVar135 = vmaxps_avx(auVar135,auVar153);
      auVar135 = vcmpps_avx(auVar135,auVar117,2);
      auVar96 = vorps_avx(auVar96,auVar135);
      auVar135 = auVar108 & auVar96;
      if ((((auVar135 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar135 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar135 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar135[0xf]
         ) {
        auVar165 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar159 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar169 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        auVar86 = ZEXT1664(auVar108);
      }
      else {
        auVar65._0_4_ = fVar13 * auVar167._0_4_;
        auVar65._4_4_ = fVar16 * auVar167._4_4_;
        auVar65._8_4_ = fVar18 * auVar167._8_4_;
        auVar65._12_4_ = fVar20 * auVar167._12_4_;
        auVar101._0_4_ = fVar12 * auVar110._0_4_;
        auVar101._4_4_ = fVar14 * auVar110._4_4_;
        auVar101._8_4_ = fVar17 * auVar110._8_4_;
        auVar101._12_4_ = fVar19 * auVar110._12_4_;
        auVar153 = vfmsub213ps_fma(auVar110,auVar163,auVar65);
        auVar118._0_4_ = fVar172 * auVar162._0_4_;
        auVar118._4_4_ = fVar173 * auVar162._4_4_;
        auVar118._8_4_ = fVar177 * auVar162._8_4_;
        auVar118._12_4_ = fVar178 * auVar162._12_4_;
        auVar127._0_4_ = fVar12 * auVar152._0_4_;
        auVar127._4_4_ = fVar14 * auVar152._4_4_;
        auVar127._8_4_ = fVar17 * auVar152._8_4_;
        auVar127._12_4_ = fVar19 * auVar152._12_4_;
        auVar56 = vfmsub213ps_fma(auVar152,auVar155,auVar118);
        auVar135 = vandps_avx(auVar65,local_36d8);
        auVar152 = vandps_avx(auVar118,local_36d8);
        auVar135 = vcmpps_avx(auVar135,auVar152,1);
        local_3768.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar56,auVar153,auVar135);
        auVar66._0_4_ = auVar156._0_4_ * fVar13;
        auVar66._4_4_ = auVar156._4_4_ * fVar16;
        auVar66._8_4_ = auVar156._8_4_ * fVar18;
        auVar66._12_4_ = auVar156._12_4_ * fVar20;
        auVar153 = vfmsub213ps_fma(auVar156,auVar163,auVar127);
        auVar119._0_4_ = fVar172 * auVar88._0_4_;
        auVar119._4_4_ = fVar173 * auVar88._4_4_;
        auVar119._8_4_ = fVar177 * auVar88._8_4_;
        auVar119._12_4_ = fVar178 * auVar88._12_4_;
        auVar56 = vfmsub213ps_fma(auVar167,auVar145,auVar119);
        auVar135 = vandps_avx(auVar119,local_36d8);
        auVar152 = vandps_avx(auVar127,local_36d8);
        auVar135 = vcmpps_avx(auVar135,auVar152,1);
        local_3768.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar153,auVar56,auVar135);
        auVar153 = vfmsub213ps_fma(auVar88,auVar155,auVar101);
        auVar162 = vfmsub213ps_fma(auVar162,auVar145,auVar66);
        auVar135 = vandps_avx(auVar101,local_36d8);
        auVar152 = vandps_avx(auVar66,local_36d8);
        auVar135 = vcmpps_avx(auVar135,auVar152,1);
        local_3768.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar162,auVar153,auVar135);
        local_3918 = auVar31._0_4_;
        fStack_3914 = auVar31._4_4_;
        fStack_3910 = auVar31._8_4_;
        auVar67._0_4_ = local_3768._32_4_ * local_3918;
        auVar67._4_4_ = local_3768._36_4_ * fStack_3914;
        auVar67._8_4_ = local_3768._40_4_ * fStack_3910;
        auVar67._12_4_ = local_3768._44_4_ * fVar171;
        auVar120 = vfmadd213ps_fma(auVar120,(undefined1  [16])local_3768.field_0.y.field_0,auVar67);
        auVar120 = vfmadd213ps_fma(auVar105,(undefined1  [16])local_3768.field_0.x.field_0,auVar120)
        ;
        auVar68._0_4_ = auVar120._0_4_ + auVar120._0_4_;
        auVar68._4_4_ = auVar120._4_4_ + auVar120._4_4_;
        auVar68._8_4_ = auVar120._8_4_ + auVar120._8_4_;
        auVar68._12_4_ = auVar120._12_4_ + auVar120._12_4_;
        auVar102._0_4_ = local_3768._32_4_ * fVar1;
        auVar102._4_4_ = local_3768._36_4_ * fVar2;
        auVar102._8_4_ = local_3768._40_4_ * fVar3;
        auVar102._12_4_ = local_3768._44_4_ * fVar11;
        auVar120 = vfmadd213ps_fma(auVar137,(undefined1  [16])local_3768.field_0.y.field_0,auVar102)
        ;
        auVar105 = vfmadd213ps_fma(auVar136,(undefined1  [16])local_3768.field_0.x.field_0,auVar120)
        ;
        auVar120 = vrcpps_avx(auVar68);
        auVar141._8_4_ = 0x3f800000;
        auVar141._0_8_ = 0x3f8000003f800000;
        auVar141._12_4_ = 0x3f800000;
        auVar135 = vfnmadd213ps_fma(auVar120,auVar68,auVar141);
        auVar120 = vfmadd132ps_fma(auVar135,auVar120,auVar120);
        local_3738._0_4_ = (auVar105._0_4_ + auVar105._0_4_) * auVar120._0_4_;
        local_3738._4_4_ = (auVar105._4_4_ + auVar105._4_4_) * auVar120._4_4_;
        local_3738._8_4_ = (auVar105._8_4_ + auVar105._8_4_) * auVar120._8_4_;
        local_3738._12_4_ = (auVar105._12_4_ + auVar105._12_4_) * auVar120._12_4_;
        auVar120 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),local_3738,2);
        auVar105 = vcmpps_avx(local_3738,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar120 = vandps_avx(auVar120,auVar105);
        uVar47 = CONCAT44(auVar68._4_4_,auVar68._0_4_);
        auVar128._0_8_ = uVar47 ^ 0x8000000080000000;
        auVar128._8_4_ = -auVar68._8_4_;
        auVar128._12_4_ = -auVar68._12_4_;
        auVar105 = vcmpps_avx(auVar68,auVar128,4);
        auVar120 = vandps_avx(auVar105,auVar120);
        auVar86 = ZEXT1664(auVar108);
        auVar105 = vandps_avx(auVar108,auVar96);
        auVar120 = vpslld_avx(auVar120,0x1f);
        auVar96 = vpsrad_avx(auVar120,0x1f);
        auVar120 = auVar105 & auVar96;
        if ((((auVar120 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar120 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar120 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < auVar120[0xf]) {
          auVar165 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar159 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar169 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        }
        else {
          auVar120 = vandps_avx(auVar96,auVar105);
          uVar4 = *(uint *)(lVar46 + lVar48);
          pGVar9 = (context->scene->geometries).items[uVar4].ptr;
          uVar37 = pGVar9->mask;
          auVar121._4_4_ = uVar37;
          auVar121._0_4_ = uVar37;
          auVar121._8_4_ = uVar37;
          auVar121._12_4_ = uVar37;
          auVar105 = vpand_avx(auVar121,*(undefined1 (*) [16])(ray + 0x90));
          auVar105 = vpcmpeqd_avx(auVar105,_DAT_01f45a50);
          auVar96 = auVar120 & ~auVar105;
          auVar165 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar159 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar169 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          if ((((auVar96 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar96 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar96 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar96[0xf] < '\0') {
            uVar38 = *(undefined4 *)(lVar46 + 0x10 + lVar48);
            auVar120 = vandnps_avx(auVar105,auVar120);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar105 = vrcpps_avx(auVar134);
              auVar129._8_4_ = 0x3f800000;
              auVar129._0_8_ = 0x3f8000003f800000;
              auVar129._12_4_ = 0x3f800000;
              auVar96 = vfnmadd213ps_fma(auVar134,auVar105,auVar129);
              auVar96 = vfmadd132ps_fma(auVar96,auVar105,auVar105);
              auVar71._8_4_ = 0x219392ef;
              auVar71._0_8_ = 0x219392ef219392ef;
              auVar71._12_4_ = 0x219392ef;
              auVar105 = vcmpps_avx(auVar95,auVar71,5);
              auVar105 = vandps_avx(auVar105,auVar96);
              auVar122._0_4_ = auVar105._0_4_ * auVar160._0_4_;
              auVar122._4_4_ = auVar105._4_4_ * auVar160._4_4_;
              auVar122._8_4_ = auVar105._8_4_ * auVar160._8_4_;
              auVar122._12_4_ = auVar105._12_4_ * auVar160._12_4_;
              auVar95 = vminps_avx(auVar122,auVar129);
              auVar72._0_4_ = auVar57._0_4_ * auVar105._0_4_;
              auVar72._4_4_ = auVar57._4_4_ * auVar105._4_4_;
              auVar72._8_4_ = auVar57._8_4_ * auVar105._8_4_;
              auVar72._12_4_ = auVar57._12_4_ * auVar105._12_4_;
              auVar105 = vminps_avx(auVar72,auVar129);
              auVar96 = vsubps_avx(auVar129,auVar95);
              auVar135 = vsubps_avx(auVar129,auVar105);
              auVar26._8_8_ = uVar35;
              auVar26._0_8_ = uVar34;
              local_3718 = vblendvps_avx(auVar95,auVar96,auVar26);
              local_3728 = vblendvps_avx(auVar105,auVar135,auVar26);
              args.valid = (int *)&Ng;
              args.geometryUserPtr = &t;
              args.context = (RTCRayQueryContext *)&v;
              args.ray = (RTCRayN *)&u;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
              ::
              _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                          *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                   *)&local_3768.field_0);
              local_3708._4_4_ = uVar4;
              local_3708._0_4_ = uVar4;
              local_3708._8_4_ = uVar4;
              local_3708._12_4_ = uVar4;
              local_3718._4_4_ = uVar38;
              local_3718._0_4_ = uVar38;
              local_3718._8_4_ = uVar38;
              local_3718._12_4_ = uVar38;
              vpcmpeqd_avx2(ZEXT1632(local_3708),ZEXT1632(local_3708));
              uStack_36f4 = context->user->instID[0];
              local_36f8 = uStack_36f4;
              uStack_36f0 = uStack_36f4;
              uStack_36ec = uStack_36f4;
              uStack_36e8 = context->user->instPrimID[0];
              uStack_36e4 = uStack_36e8;
              uStack_36e0 = uStack_36e8;
              uStack_36dc = uStack_36e8;
              auVar105 = *(undefined1 (*) [16])(ray + 0x80);
              auVar95 = vblendvps_avx(auVar105,(undefined1  [16])t.field_0,auVar120);
              *(undefined1 (*) [16])(ray + 0x80) = auVar95;
              args.valid = (int *)local_38b8;
              args.geometryUserPtr = pGVar9->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)&local_3768;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              local_38b8 = auVar120;
              if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar9->occlusionFilterN)(&args);
              }
              if (local_38b8 == (undefined1  [16])0x0) {
                auVar120 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar120 = auVar120 ^ _DAT_01f46b70;
                auVar165 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar159 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                auVar169 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              }
              else {
                p_Var10 = context->args->filter;
                if (p_Var10 == (RTCFilterFunctionN)0x0) {
                  auVar165 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                  auVar159 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)))
                  ;
                  auVar169 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)))
                  ;
                }
                else {
                  auVar165 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                  auVar159 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)))
                  ;
                  auVar169 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)))
                  ;
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar9->field_8).field_0x2 & 0x40) != 0)
                     ) {
                    (*p_Var10)(&args);
                    auVar169 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)
                                                 ));
                    auVar159 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)
                                                 ));
                    auVar165 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                 ));
                  }
                }
                auVar95 = vpcmpeqd_avx(local_38b8,_DAT_01f45a50);
                auVar120 = auVar95 ^ _DAT_01f46b70;
                auVar106._8_4_ = 0xff800000;
                auVar106._0_8_ = 0xff800000ff800000;
                auVar106._12_4_ = 0xff800000;
                auVar95 = vblendvps_avx(auVar106,*(undefined1 (*) [16])(args.ray + 0x80),auVar95);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar95;
              }
              auVar95 = vpslld_avx(auVar120,0x1f);
              auVar120 = vpsrad_avx(auVar95,0x1f);
              auVar105 = vblendvps_avx(auVar105,*(undefined1 (*) [16])local_38a0,auVar95);
              *(undefined1 (*) [16])local_38a0 = auVar105;
            }
            auVar120 = vpandn_avx(auVar120,auVar108);
            auVar86 = ZEXT1664(auVar120);
          }
        }
      }
      lVar48 = lVar48 + 4;
      auVar108 = auVar86._0_16_;
    } while ((((auVar108 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (auVar108 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar108 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             auVar86[0xf] < '\0');
    auVar86 = ZEXT1664(local_3888);
    auVar105 = vandps_avx(auVar108,local_3888);
    lVar40 = lVar40 + 1;
    lVar46 = lVar46 + 0x60;
    auVar108 = local_3888 & auVar108;
    auVar120 = local_3888;
    local_3888 = auVar105;
  } while ((((auVar108 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (auVar108 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar108 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           auVar108[0xf] < '\0');
  auVar120 = vpcmpeqd_avx(auVar120,auVar120);
  auVar73._0_4_ = local_3888._0_4_ ^ auVar120._0_4_;
  auVar73._4_4_ = local_3888._4_4_ ^ auVar120._4_4_;
  auVar73._8_4_ = local_3888._8_4_ ^ auVar120._8_4_;
  auVar73._12_4_ = local_3888._12_4_ ^ auVar120._12_4_;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx(auVar73,(undefined1  [16])terminated.field_0);
  auVar120 = auVar120 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar120 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar120 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar120 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar120[0xf])
  goto LAB_01640864;
  auVar86 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
  auVar107._8_4_ = 0xff800000;
  auVar107._0_8_ = 0xff800000ff800000;
  auVar107._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar107,
                     (undefined1  [16])terminated.field_0);
  goto LAB_0163f326;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }